

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O2

string * CopyrightHolders(string *__return_storage_ptr__,string *strPrefix)

{
  size_type sVar1;
  long in_FS_OFFSET;
  string copyright_devs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  bilingual_str local_78;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _(&local_78,(ConstevalStringLiteral)0x1a5e4f);
  tinyformat::format<char[13]>(&local_38,&local_78.translated,(char (*) [13])"Bitcoin Core");
  bilingual_str::~bilingual_str(&local_78);
  std::operator+(__return_storage_ptr__,strPrefix,&local_38);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_38,"Bitcoin Core",0);
  if (sVar1 == 0xffffffffffffffff) {
    std::operator+(&bStack_98,"\n",strPrefix);
    std::operator+(&local_78.original,&bStack_98,"The Bitcoin Core developers");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_78.original);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&bStack_98);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CopyrightHolders(const std::string& strPrefix)
{
    const auto copyright_devs = strprintf(_(COPYRIGHT_HOLDERS).translated, COPYRIGHT_HOLDERS_SUBSTITUTION);
    std::string strCopyrightHolders = strPrefix + copyright_devs;

    // Make sure Bitcoin Core copyright is not removed by accident
    if (copyright_devs.find("Bitcoin Core") == std::string::npos) {
        strCopyrightHolders += "\n" + strPrefix + "The Bitcoin Core developers";
    }
    return strCopyrightHolders;
}